

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_set.c
# Opt level: O1

int mpt_path_set(mpt_path *path,char *val,int len)

{
  char cVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  cVar1 = path->sep;
  cVar2 = path->assign;
  iVar11 = 0;
  if (val == (char *)0x0) {
    lVar10 = 0;
    uVar5 = 0;
  }
  else {
    if (len < 0) {
      sVar4 = strlen(val);
      uVar5 = sVar4 + 1;
    }
    else {
      uVar5 = (ulong)(uint)len;
    }
    lVar10 = 1;
  }
  uVar9 = 0;
  uVar6 = 0;
  do {
    uVar7 = uVar5;
    if (uVar5 == uVar6) break;
    cVar3 = val[uVar6];
    if (cVar3 == cVar2) {
      iVar11 = iVar11 + 1;
      lVar10 = 0;
    }
    else if ((cVar3 == cVar1) && (bVar12 = iVar11 == 0, iVar11 = iVar11 + 1, bVar12)) {
      uVar9 = uVar6;
    }
    uVar6 = uVar6 + 1;
    uVar7 = uVar6;
  } while (cVar3 != cVar2);
  mpt_path_fini(path);
  path->base = val;
  path->off = 0;
  path->len = lVar10 + uVar7;
  uVar8 = (uint8_t)uVar9;
  if (0xff < uVar9) {
    uVar8 = '\0';
  }
  path->first = uVar8;
  path->sep = cVar1;
  path->assign = cVar2;
  path->flags = '\0';
  return iVar11;
}

Assistant:

extern int mpt_path_set(MPT_STRUCT(path) *path, const char *val, int len)
{
	size_t vlen, plen = 0, first = 0, add = 1;
	int elem = 0;
	char sep, assign;
	
	sep = path->sep;
	assign = path->assign;
	
	if (!val) {
		vlen = add = 0;
	} else {
		vlen = (len < 0) ? strlen(val) + 1 : (size_t) len;
	}
	
	while (plen < vlen) {
		char curr = val[plen++];
		
		/* inline assignment */
		if (curr == assign) {
			add = 0;
			++elem;
			break;
		}
		/* separator found, save length of first part */
		if ((curr == sep) && !elem++) {
			first = plen - 1;
		}
	}
	mpt_path_fini(path);
	
	path->base = val;
	path->off  = 0;
	path->len  = plen + add;
	
	path->first  = (first > UINT8_MAX) ? 0 : first;
	path->sep    = sep;
	path->assign = assign;
	path->flags  = 0;
	
	return elem;
}